

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

ProcessorProperty * __thiscall
soul::StructuralParser::parseProcessorProperty(StructuralParser *this)

{
  ModuleBase *pMVar1;
  int iVar2;
  UnqualifiedName *this_00;
  ProcessorProperty *pPVar3;
  Property property;
  Context context;
  Property local_c4;
  Context local_c0;
  string local_a8;
  CompileMessage local_88;
  CompileMessage local_50;
  
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x288ec7);
  local_c0.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
  if (local_c0.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_c0.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_c0.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_c0.location.location.data = (this->super_SOULTokeniser).location.location.data;
  local_c0.parentScope = this->currentScope;
  this_00 = parseUnqualifiedName(this);
  AST::UnqualifiedName::toString_abi_cxx11_(&local_a8,this_00);
  local_c4 = heart::ProcessorProperty::getPropertyFromName(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_c4 == none) {
    CompileMessageHelpers::createMessage<>(&local_50,syntax,error,"Unknown processor property name")
    ;
    AST::Context::throwError
              (&(this_00->super_Expression).super_Statement.super_ASTObject.context,&local_50,false)
    ;
  }
  pMVar1 = (this->module).object;
  if (pMVar1 != (ModuleBase *)0x0) {
    iVar2 = (*(pMVar1->super_ASTObject)._vptr_ASTObject[4])();
    if ((char)iVar2 == '\0') {
      pMVar1 = (this->module).object;
      if (pMVar1 == (ModuleBase *)0x0) goto LAB_001da503;
      iVar2 = (*(pMVar1->super_ASTObject)._vptr_ASTObject[5])();
      if ((char)iVar2 == '\0') {
        CompileMessageHelpers::createMessage<>
                  (&local_88,syntax,error,
                   "Processor properties are only valid inside a processor declaration");
        AST::Context::throwError(&local_c0,&local_88,false);
      }
    }
    pPVar3 = PoolAllocator::
             allocate<soul::AST::ProcessorProperty,soul::AST::Context&,soul::heart::ProcessorProperty::Property&>
                       (&this->allocator->pool,&local_c0,&local_c4);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_c0.location.sourceCode.object);
    return pPVar3;
  }
LAB_001da503:
  throwInternalCompilerError("object != nullptr","operator->",0x3c);
}

Assistant:

AST::ProcessorProperty& parseProcessorProperty()
    {
        expect (Operator::dot);
        auto context = getContext();
        auto& propertyName = parseUnqualifiedName();

        auto property = heart::ProcessorProperty::getPropertyFromName (propertyName.toString());

        if (property == heart::ProcessorProperty::Property::none)
            propertyName.context.throwError (Errors::unknownProperty());

        if (! (module->isProcessor() || module->isGraph()))
            context.throwError (Errors::propertiesOutsideProcessor());

        return allocate<AST::ProcessorProperty> (context, property);
    }